

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cpp
# Opt level: O0

int __thiscall
ncnn::Scale::forward_inplace
          (Scale *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  reference pvVar6;
  reference pvVar7;
  int iVar8;
  long lVar9;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  int i_5;
  float s_3;
  float *ptr_4;
  int q_1;
  int i_4;
  float bias_1;
  float s_2;
  float *ptr_3;
  int q;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j_1;
  float s_1;
  float *ptr_2;
  int i_3;
  int j;
  float bias;
  float s;
  float *ptr_1;
  int i_2;
  int h;
  int w_1;
  int i_1;
  int i;
  float *ptr;
  int w;
  int dims;
  Mat *scale_blob;
  Mat *bottom_top_blob;
  Mat *m_1;
  Mat *m;
  int local_3a0;
  int local_344;
  int local_340;
  int local_2d4;
  int local_2c0;
  int local_2b0;
  int local_2ac;
  int local_294;
  int local_288;
  int local_284;
  
  pvVar6 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  pvVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,1);
  iVar3 = pvVar6->dims;
  if (iVar3 == 1) {
    iVar8 = pvVar6->w;
    pvVar5 = pvVar6->data;
    if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_288 = 0; local_288 < iVar8; local_288 = local_288 + 1) {
        *(float *)((long)pvVar5 + (long)local_288 * 4) =
             *(float *)((long)pvVar7->data + (long)local_288 * 4) *
             *(float *)((long)pvVar5 + (long)local_288 * 4);
      }
    }
    else {
      for (local_284 = 0; local_284 < iVar8; local_284 = local_284 + 1) {
        *(float *)((long)pvVar5 + (long)local_284 * 4) =
             *(float *)((long)pvVar5 + (long)local_284 * 4) *
             *(float *)((long)pvVar7->data + (long)local_284 * 4) +
             *(float *)(*(long *)(in_RDI + 0x120) + (long)local_284 * 4);
      }
    }
  }
  if (iVar3 == 2) {
    iVar8 = pvVar6->w;
    iVar4 = pvVar6->h;
    if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_2b0 = 0; local_2b0 < iVar4; local_2b0 = local_2b0 + 1) {
        pvVar5 = pvVar6->data;
        lVar9 = (long)pvVar6->w * (long)local_2b0 * pvVar6->elemsize;
        fVar1 = *(float *)((long)pvVar7->data + (long)local_2b0 * 4);
        for (local_2c0 = 0; local_2c0 < iVar8; local_2c0 = local_2c0 + 1) {
          *(float *)((long)pvVar5 + (long)local_2c0 * 4 + lVar9) =
               fVar1 * *(float *)((long)pvVar5 + (long)local_2c0 * 4 + lVar9);
        }
      }
    }
    else {
      for (local_294 = 0; local_294 < iVar4; local_294 = local_294 + 1) {
        pvVar5 = pvVar6->data;
        lVar9 = (long)pvVar6->w * (long)local_294 * pvVar6->elemsize;
        fVar1 = *(float *)((long)pvVar7->data + (long)local_294 * 4);
        fVar2 = *(float *)(*(long *)(in_RDI + 0x120) + (long)local_294 * 4);
        for (local_2ac = 0; local_2ac < iVar8; local_2ac = local_2ac + 1) {
          *(float *)((long)pvVar5 + (long)local_2ac * 4 + lVar9) =
               *(float *)((long)pvVar5 + (long)local_2ac * 4 + lVar9) * fVar1 + fVar2;
        }
      }
    }
  }
  if (iVar3 == 3) {
    iVar3 = pvVar6->c;
    iVar8 = pvVar6->w * pvVar6->h;
    if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_344 = 0; local_344 < iVar3; local_344 = local_344 + 1) {
        pvVar5 = pvVar6->data;
        lVar9 = pvVar6->cstep * (long)local_344 * pvVar6->elemsize;
        fVar1 = *(float *)((long)pvVar7->data + (long)local_344 * 4);
        for (local_3a0 = 0; local_3a0 < iVar8; local_3a0 = local_3a0 + 1) {
          *(float *)((long)pvVar5 + (long)local_3a0 * 4 + lVar9) =
               fVar1 * *(float *)((long)pvVar5 + (long)local_3a0 * 4 + lVar9);
        }
      }
    }
    else {
      for (local_2d4 = 0; local_2d4 < iVar3; local_2d4 = local_2d4 + 1) {
        pvVar5 = pvVar6->data;
        lVar9 = pvVar6->cstep * (long)local_2d4 * pvVar6->elemsize;
        fVar1 = *(float *)((long)pvVar7->data + (long)local_2d4 * 4);
        fVar2 = *(float *)(*(long *)(in_RDI + 0x120) + (long)local_2d4 * 4);
        for (local_340 = 0; local_340 < iVar8; local_340 = local_340 + 1) {
          *(float *)((long)pvVar5 + (long)local_340 * 4 + lVar9) =
               *(float *)((long)pvVar5 + (long)local_340 * 4 + lVar9) * fVar1 + fVar2;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Scale::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    Mat& bottom_top_blob = bottom_top_blobs[0];
    const Mat& scale_blob = bottom_top_blobs[1];

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                ptr[i] = ptr[i] * scale_blob[i] + bias_data[i];
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                ptr[i] *= scale_blob[i];
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                float s = scale_blob[i];
                float bias = bias_data[i];

                for (int j = 0; j < w; j++)
                {
                    ptr[j] = ptr[j] * s + bias;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                float s = scale_blob[i];

                for (int j = 0; j < w; j++)
                {
                    ptr[j] *= s;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        if (bias_term)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                float s = scale_blob[q];
                float bias = bias_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * s + bias;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                float s = scale_blob[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] *= s;
                }
            }
        }
    }

    return 0;
}